

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O0

OperatorResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ExecuteInternal
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,GlobalOperatorState *gstate_p,OperatorState *state)

{
  char cVar1;
  bool bVar2;
  idx_t iVar3;
  string *msg;
  DataChunk *in_RCX;
  DataChunk *in_RDX;
  PhysicalJoin *in_RDI;
  DataChunk *in_R8;
  MergeJoinGlobalState *gstate;
  OperatorState *in_stack_00000228;
  DataChunk *in_stack_00000230;
  DataChunk *in_stack_00000238;
  ExecutionContext *in_stack_00000240;
  PhysicalPiecewiseMergeJoin *in_stack_00000248;
  OperatorState *in_stack_00000860;
  DataChunk *in_stack_00000868;
  DataChunk *in_stack_00000870;
  ExecutionContext *in_stack_00000878;
  PhysicalPiecewiseMergeJoin *in_stack_00000880;
  GlobalSinkState *in_stack_ffffffffffffff70;
  allocator *this_00;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar4;
  allocator local_61;
  string local_60 [32];
  MergeJoinGlobalState *local_40;
  undefined2 uVar5;
  OperatorResultType local_1;
  
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
  operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)in_stack_ffffffffffffff70);
  local_40 = GlobalSinkState::Cast<duckdb::MergeJoinGlobalState>(in_stack_ffffffffffffff70);
  iVar3 = MergeJoinGlobalState::Count((MergeJoinGlobalState *)0x1815668);
  if (iVar3 == 0) {
    bVar2 = PhysicalJoin::EmptyResultIfRHSIsEmpty(in_RDI);
    uVar5 = (undefined2)((ulong)in_RDX >> 0x30);
    if (bVar2) {
      local_1 = FINISHED;
    }
    else {
      uVar4 = (in_RDI->super_CachingPhysicalOperator).field_0x81;
      unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
      ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    *)in_stack_ffffffffffffff70);
      ::std::__atomic_base::operator_cast_to_unsigned_long
                ((__atomic_base<unsigned_long> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
      PhysicalComparisonJoin::ConstructEmptyJoinResult
                ((JoinType)((ushort)uVar5 >> 8),SUB21(uVar5,0),in_RCX,in_R8);
      local_1 = NEED_MORE_INPUT;
    }
  }
  else {
    DataChunk::Verify(in_RDX);
    cVar1 = (in_RDI->super_CachingPhysicalOperator).field_0x81;
    if ((byte)(cVar1 - 1U) < 4) {
      local_1 = ResolveComplexJoin(in_stack_00000248,in_stack_00000240,in_stack_00000238,
                                   in_stack_00000230,in_stack_00000228);
    }
    else {
      if (2 < (byte)(cVar1 - 5U)) {
        msg = (string *)__cxa_allocate_exception(0x10);
        this_00 = &local_61;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_60,"Unimplemented type for piecewise merge loop join!",this_00);
        NotImplementedException::NotImplementedException((NotImplementedException *)this_00,msg);
        __cxa_throw(msg,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      ResolveSimpleJoin(in_stack_00000880,in_stack_00000878,in_stack_00000870,in_stack_00000868,
                        in_stack_00000860);
      local_1 = NEED_MORE_INPUT;
    }
  }
  return local_1;
}

Assistant:

OperatorResultType PhysicalPiecewiseMergeJoin::ExecuteInternal(ExecutionContext &context, DataChunk &input,
                                                               DataChunk &chunk, GlobalOperatorState &gstate_p,
                                                               OperatorState &state) const {
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();

	if (gstate.Count() == 0) {
		// empty RHS
		if (!EmptyResultIfRHSIsEmpty()) {
			ConstructEmptyJoinResult(join_type, gstate.table->has_null, input, chunk);
			return OperatorResultType::NEED_MORE_INPUT;
		} else {
			return OperatorResultType::FINISHED;
		}
	}

	input.Verify();
	switch (join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI:
	case JoinType::MARK:
		// simple joins can have max STANDARD_VECTOR_SIZE matches per chunk
		ResolveSimpleJoin(context, input, chunk, state);
		return OperatorResultType::NEED_MORE_INPUT;
	case JoinType::LEFT:
	case JoinType::INNER:
	case JoinType::RIGHT:
	case JoinType::OUTER:
		return ResolveComplexJoin(context, input, chunk, state);
	default:
		throw NotImplementedException("Unimplemented type for piecewise merge loop join!");
	}
}